

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O3

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
ConstraintsBiLoad_C(ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                    *this,double factor,double recovery_clamp,bool do_clamp)

{
  double dVar1;
  double dVar2;
  
  ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::ConstraintsBiLoad_C
            (&this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>,
             factor,recovery_clamp,do_clamp);
  dVar1 = ((((this->
             super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
             super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>.
            container)->super_ChPhysicsItem).system)->step;
  dVar2 = 1.0 / (dVar1 * (dVar1 + (this->
                                  super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                                  ).dampingf));
  dVar1 = dVar2 * (double)this->complianceRoll;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.cfm_i = dVar1;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.cfm_i = dVar1;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.cfm_i = dVar2 * (double)this->complianceSpin;
  return;
}

Assistant:

virtual void ConstraintsBiLoad_C(double factor = 1., double recovery_clamp = 0.1, bool do_clamp = false) override {
        // base behaviour too
        ChContactNSC<Ta, Tb>::ConstraintsBiLoad_C(factor, recovery_clamp, do_clamp);

        // If rolling and spinning compliance, set the cfm terms
        double h = this->container->GetSystem()->GetStep();

        //***TODO*** move to KRMmatricesLoad() the following, and only for !bounced case
        double alpha = this->dampingf;              // [R]=alpha*[K]
        double inv_hhpa = 1.0 / (h * (h + alpha));  // 1/(h*(h+a))

        this->Ru.Set_cfm_i((inv_hhpa) * this->complianceRoll);
        this->Rv.Set_cfm_i((inv_hhpa) * this->complianceRoll);
        this->Rx.Set_cfm_i((inv_hhpa) * this->complianceSpin);

        // Assume no residual ever, do not load in C
    }